

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command_line_interface.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::CommandLineInterface::ErrorPrinter::AddWarning
          (ErrorPrinter *this,int line,int column,string *message)

{
  string *message_00;
  int column_00;
  int line_00;
  allocator local_79;
  string local_78;
  allocator local_41;
  string local_40;
  string *local_20;
  string *message_local;
  int column_local;
  int line_local;
  ErrorPrinter *this_local;
  
  local_20 = message;
  message_local._0_4_ = column;
  message_local._4_4_ = line;
  _column_local = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_40,"input",&local_41);
  line_00 = message_local._4_4_;
  column_00 = (int)message_local;
  message_00 = local_20;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_78,"warning",&local_79);
  AddErrorOrWarning(this,&local_40,line_00,column_00,message_00,&local_78,(ostream *)&std::clog);
  std::__cxx11::string::~string((string *)&local_78);
  std::allocator<char>::~allocator((allocator<char> *)&local_79);
  std::__cxx11::string::~string((string *)&local_40);
  std::allocator<char>::~allocator((allocator<char> *)&local_41);
  return;
}

Assistant:

void AddWarning(int line, int column, const std::string& message) override {
    AddErrorOrWarning("input", line, column, message, "warning", std::clog);
  }